

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_fp_denorm(Impl *this)

{
  bool bVar1;
  Function *this_00;
  Builder *pBVar2;
  Function *entryPoint;
  ExecutionMode mode;
  Capability cap;
  Attribute attr;
  String str;
  
  this_00 = get_entry_point_function(this->entry_point_meta);
  if (this_00 == (Function *)0x0) {
    return true;
  }
  attr = LLVMBC::Function::getFnAttribute(this_00,"fp32-denorm-mode");
  LLVMBC::Attribute::getValueAsString_abi_cxx11_(&str,&attr);
  bVar1 = std::operator==(&str,"ftz");
  if (bVar1) {
    mode = ExecutionModeDenormFlushToZero;
    cap = CapabilityDenormFlushToZero;
  }
  else {
    bVar1 = std::operator==(&str,"preserve");
    if (!bVar1) goto LAB_0011c005;
    mode = ExecutionModeDenormPreserve;
    cap = CapabilityDenormPreserve;
  }
  pBVar2 = builder(this);
  spv::Builder::addExtension(pBVar2,"SPV_KHR_float_controls");
  pBVar2 = builder(this);
  spv::Builder::addCapability(pBVar2,cap);
  pBVar2 = builder(this);
  entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
  spv::Builder::addExecutionMode(pBVar2,entryPoint,mode,0x20,-1,-1);
LAB_0011c005:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&str);
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_fp_denorm()
{
	// Check for SM 6.2 denorm handling. Only applies to FP32.
	auto *func = get_entry_point_function(entry_point_meta);
	if (!func)
		return true;

	auto attr = func->getFnAttribute("fp32-denorm-mode");
	auto str = attr.getValueAsString();
	if (str == "ftz")
	{
		builder().addExtension("SPV_KHR_float_controls");
		builder().addCapability(spv::CapabilityDenormFlushToZero);
		builder().addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormFlushToZero, 32);
	}
	else if (str == "preserve")
	{
		builder().addExtension("SPV_KHR_float_controls");
		builder().addCapability(spv::CapabilityDenormPreserve);
		builder().addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 32);
	}

	return true;
}